

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O3

void __thiscall amount_tests::GetFeeTest::test_method(GetFeeTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  check_type cVar3;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  CAmount local_110;
  CAmount local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  CFeeRate altFeeRate;
  CFeeRate local_b8;
  CAmount *local_b0;
  assertion_result local_a8;
  CAmount **local_90;
  CAmount *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  CAmount **local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  altFeeRate.nSatoshisPerK = 0;
  local_b8.nSatoshisPerK = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0);
  local_88 = &local_108;
  local_b0 = &local_110;
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_68 = &local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c94b,(size_t)&local_60,0x1d,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1e;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,100000);
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c968,(size_t)&local_60,0x1e,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b8.nSatoshisPerK = 1000;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x22;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0);
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c94b,(size_t)&local_60,0x22,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x23;
  file_02.m_begin = (iterator)&local_160;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_170,
             msg_02);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,1);
  local_110 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c97c,(size_t)&local_60,0x23,
             &local_80,"CAmount(1)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0x79);
  local_110 = 0x79;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x79);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c999,(size_t)&local_60,0x24,
             &local_80,"CAmount(121)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_1a0;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1b0,
             msg_04);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,999);
  local_110 = 999;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 999);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9ba,(size_t)&local_60,0x25,
             &local_80,"CAmount(999)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_1c0;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1d0,
             msg_05);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,1000);
  local_110 = 1000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 1000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9db,(size_t)&local_60,0x26,
             &local_80,"CAmount(1e3)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x27;
  file_06.m_begin = (iterator)&local_1e0;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f0,
             msg_06);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,9000);
  local_110 = 9000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 9000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9fc,(size_t)&local_60,0x27,
             &local_80,"CAmount(9e3)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b8.nSatoshisPerK = -1000;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2b;
  file_07.m_begin = (iterator)&local_200;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_210,
             msg_07);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0);
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c94b,(size_t)&local_60,0x2b,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2c;
  file_08.m_begin = (iterator)&local_220;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_230,
             msg_08);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,1);
  local_110 = -1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c97c,(size_t)&local_60,0x2c,
             &local_80,"CAmount(-1)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2d;
  file_09.m_begin = (iterator)&local_240;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_250,
             msg_09);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0x79);
  local_110 = -0x79;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -0x79);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c999,(size_t)&local_60,0x2d,
             &local_80,"CAmount(-121)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2e;
  file_10.m_begin = (iterator)&local_260;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_270,
             msg_10);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,999);
  local_110 = -999;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -999);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9ba,(size_t)&local_60,0x2e,
             &local_80,"CAmount(-999)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x2f;
  file_11.m_begin = (iterator)&local_280;
  msg_11.m_end = pvVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_290,
             msg_11);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,1000);
  local_110 = -1000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -1000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9db,(size_t)&local_60,0x2f,
             &local_80,"CAmount(-1e3)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x30;
  file_12.m_begin = (iterator)&local_2a0;
  msg_12.m_end = pvVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2b0,
             msg_12);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,9000);
  local_110 = -9000;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -9000);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9fc,(size_t)&local_60,0x30,
             &local_80,"CAmount(-9e3)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b8.nSatoshisPerK = 0x7b;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x34;
  file_13.m_begin = (iterator)&local_2c0;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_2d0,
             msg_13);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0);
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c94b,(size_t)&local_60,0x34,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x35;
  file_14.m_begin = (iterator)&local_2e0;
  msg_14.m_end = pvVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_2f0,
             msg_14);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,8);
  local_110 = 1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5ca61,(size_t)&local_60,0x35,
             &local_80,"CAmount(1)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x36;
  file_15.m_begin = (iterator)&local_300;
  msg_15.m_end = pvVar2;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_310,
             msg_15);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,9);
  local_110 = 2;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 2);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5ca73,(size_t)&local_60,0x36,
             &local_80,"CAmount(2)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x37;
  file_16.m_begin = (iterator)&local_320;
  msg_16.m_end = pvVar2;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_330,
             msg_16);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0x79);
  local_110 = 0xf;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0xf);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c999,(size_t)&local_60,0x37,
             &local_80,"CAmount(15)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x38;
  file_17.m_begin = (iterator)&local_340;
  msg_17.m_end = pvVar2;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_350,
             msg_17);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0x7a);
  local_110 = 0x10;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x10);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5ca9c,(size_t)&local_60,0x38,
             &local_80,"CAmount(16)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x39;
  file_18.m_begin = (iterator)&local_360;
  msg_18.m_end = pvVar2;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_370,
             msg_18);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,999);
  local_110 = 0x7b;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x7b);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9ba,(size_t)&local_60,0x39,
             &local_80,"CAmount(123)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3a;
  file_19.m_begin = (iterator)&local_380;
  msg_19.m_end = pvVar2;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_390,
             msg_19);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,1000);
  local_110 = 0x7b;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x7b);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9db,(size_t)&local_60,0x3a,
             &local_80,"CAmount(123)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3b;
  file_20.m_begin = (iterator)&local_3a0;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_3b0,
             msg_20);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,9000);
  local_110 = 0x453;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0x453);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c9fc,(size_t)&local_60,0x3b,
             &local_80,"CAmount(1107)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b8.nSatoshisPerK = -0x7b;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3f;
  file_21.m_begin = (iterator)&local_3c0;
  msg_21.m_end = pvVar2;
  msg_21.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_3d0,
             msg_21);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,0);
  local_110 = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5c94b,(size_t)&local_60,0x3f,
             &local_80,"CAmount(0)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x40;
  file_22.m_begin = (iterator)&local_3e0;
  msg_22.m_end = pvVar2;
  msg_22.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_3f0,
             msg_22);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,8);
  local_110 = -1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5ca61,(size_t)&local_60,0x40,
             &local_80,"CAmount(-1)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x41;
  file_23.m_begin = (iterator)&local_400;
  msg_23.m_end = pvVar2;
  msg_23.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_410,
             msg_23);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,9);
  local_110 = -1;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == -1);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_b0 = &local_110;
  local_88 = &local_108;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5ca73,(size_t)&local_60,0x41,
             &local_80,"CAmount(-1)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_b8.nSatoshisPerK = 1000;
  altFeeRate.nSatoshisPerK = 1000;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x46;
  file_24.m_begin = (iterator)&local_420;
  msg_24.m_end = pvVar2;
  msg_24.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_430,
             msg_24);
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  local_100._0_8_ = &PTR__lazy_ostream_013ae088;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_108 = CFeeRate::GetFee(&local_b8,100);
  local_110 = CFeeRate::GetFee(&altFeeRate,100);
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 == local_110);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_58 = "";
  local_88 = &local_108;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae428;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_88;
  local_b0 = &local_110;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013ae428;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_100,1,2,REQUIRE,0xe5cad7,(size_t)&local_60,0x46,
             &local_80,"altFeeRate.GetFee(100)",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x49;
  file_25.m_begin = (iterator)&local_440;
  msg_25.m_end = pvVar2;
  msg_25.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_450,
             msg_25);
  local_60 = (char *)0xffffffffffffffff;
  _cVar3 = 0x25b5a2;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(-1), 0) == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_458 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_460,0x49);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x4a;
  file_26.m_begin = (iterator)&local_470;
  msg_26.m_end = pvVar2;
  msg_26.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_480,
             msg_26);
  local_60 = (char *)0x0;
  _cVar3 = 0x25b68b;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(0), 0) == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_488 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_490,0x4a);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x4b;
  file_27.m_begin = (iterator)&local_4a0;
  msg_27.m_end = pvVar2;
  msg_27.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_4b0,
             msg_27);
  local_60 = (char *)0x1;
  _cVar3 = 0x25b77b;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(1), 0) == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4b8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_4c0,0x4b);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x4d;
  file_28.m_begin = (iterator)&local_4d0;
  msg_28.m_end = pvVar2;
  msg_28.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_4e0,
             msg_28);
  local_60 = (char *)0xffffffffffffffff;
  _cVar3 = 0x25b870;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,1000);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == -1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(-1), 1000) == CFeeRate(-1)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4e8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_4f0,0x4d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x4e;
  file_29.m_begin = (iterator)&local_500;
  msg_29.m_end = pvVar2;
  msg_29.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_510,
             msg_29);
  local_60 = (char *)0x0;
  _cVar3 = 0x25b963;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,1000);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(0), 1000) == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_518 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_520,0x4e);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x4f;
  file_30.m_begin = (iterator)&local_530;
  msg_30.m_end = pvVar2;
  msg_30.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_540,
             msg_30);
  local_60 = (char *)0x1;
  _cVar3 = 0x25ba56;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,1000);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(1), 1000) == CFeeRate(1)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_548 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_550,0x4f);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x51;
  file_31.m_begin = (iterator)&local_560;
  msg_31.m_end = pvVar2;
  msg_31.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_570,
             msg_31);
  local_60 = (char *)0x1;
  _cVar3 = 0x25bb4e;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0x3e9);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(1), 1001) == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_578 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_580,0x51);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x52;
  file_32.m_begin = (iterator)&local_590;
  msg_32.m_end = pvVar2;
  msg_32.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_5a0,
             msg_32);
  local_60 = (char *)0x2;
  _cVar3 = 0x25bc43;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0x3e9);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 1);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(2), 1001) == CFeeRate(1)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5a8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_5b0,0x52);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x54;
  file_33.m_begin = (iterator)&local_5c0;
  msg_33.m_end = pvVar2;
  msg_33.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_5d0,
             msg_33);
  local_60 = (char *)0x1a;
  _cVar3 = 0x25bd38;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0x315);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0x20);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(26), 789) == CFeeRate(32)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5d8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_5e0,0x54);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x55;
  file_34.m_begin = (iterator)&local_5f0;
  msg_34.m_end = pvVar2;
  msg_34.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_600,
             msg_34);
  local_60 = (char *)0x1b;
  _cVar3 = 0x25be2d;
  CFeeRate::CFeeRate((CFeeRate *)&local_50,(CAmount *)&local_60,0x315);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (CONCAT71(local_50._1_7_,
                 local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) == 0x22);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "CFeeRate(CAmount(27), 789) == CFeeRate(34)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_608 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_610,0x55);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  CFeeRate::CFeeRate((CFeeRate *)&local_80,&MAX_MONEY,0xffffffff);
  local_b8.nSatoshisPerK = 1000;
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25bf1f;
  file_35.m_end = (iterator)0x5c;
  file_35.m_begin = (iterator)&local_620;
  msg_35.m_end = pvVar2;
  msg_35.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_630,
             msg_35);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "0 * feeRate == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_638 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_640,0x5c);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25bfe9;
  file_36.m_end = (iterator)0x5d;
  file_36.m_begin = (iterator)&local_650;
  msg_36.m_end = pvVar2;
  msg_36.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_660,
             msg_36);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "feeRate * 0 == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_668 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_670,0x5d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c0af;
  file_37.m_end = (iterator)0x5f;
  file_37.m_begin = (iterator)&local_680;
  msg_37.m_end = pvVar2;
  msg_37.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_690,
             msg_37);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 1000);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "3 * feeRate == CFeeRate(3000)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_698 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_6a0,0x5f);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c181;
  file_38.m_end = (iterator)0x60;
  file_38.m_begin = (iterator)&local_6b0;
  msg_38.m_end = pvVar2;
  msg_38.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_6c0,
             msg_38);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 1000);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "feeRate * 3 == CFeeRate(3000)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6c8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_6d0,0x60);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c253;
  file_39.m_end = (iterator)0x62;
  file_39.m_begin = (iterator)&local_6e0;
  msg_39.m_end = pvVar2;
  msg_39.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_6f0,
             msg_39);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 1000);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "-3 * feeRate == CFeeRate(-3000)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6f8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_700,0x62);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c325;
  file_40.m_end = (iterator)0x63;
  file_40.m_begin = (iterator)&local_710;
  msg_40.m_end = pvVar2;
  msg_40.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_720,
             msg_40);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 1000);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "feeRate * -3 == CFeeRate(-3000)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_728 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_730,99);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c3f7;
  file_41.m_end = (iterator)0x65;
  file_41.m_begin = (iterator)&local_740;
  msg_41.m_end = pvVar2;
  msg_41.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_750,
             msg_41);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "2 * feeRate == feeRate * 2";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_758 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_760,0x65);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c4bd;
  file_42.m_end = &DAT_00000068;
  file_42.m_begin = (iterator)&local_770;
  msg_42.m_end = pvVar2;
  msg_42.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_780,
             msg_42);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "largeNumber * feeRate == feeRate * largeNumber";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_788 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_790,0x68);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_b8.nSatoshisPerK = 0x7fffffff;
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c596;
  file_43.m_end = (iterator)0x6c;
  file_43.m_begin = (iterator)&local_7a0;
  msg_43.m_end = pvVar2;
  msg_43.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_7b0,
             msg_43);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 0x7fffffff);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "feeRate * 2 == CFeeRate(static_cast<int64_t>(maxInt) * 2)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7b8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_7c0,0x6c);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c664;
  file_44.m_end = (iterator)0x6d;
  file_44.m_begin = (iterator)&local_7d0;
  msg_44.m_end = pvVar2;
  msg_44.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_7e0,
             msg_44);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 0x7fffffff);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "2 * feeRate == CFeeRate(static_cast<int64_t>(maxInt) * 2)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7e8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_7f0,0x6d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_b8.nSatoshisPerK = 0;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c738;
  file_45.m_end = (iterator)0x70;
  file_45.m_begin = (iterator)&local_800;
  msg_45.m_end = pvVar2;
  msg_45.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_810,
             msg_45);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_b8.nSatoshisPerK == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "feeRate * 5 == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_818 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_820,0x70);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x25c7fd;
  file_46.m_end = (iterator)0x71;
  file_46.m_begin = (iterator)&local_830;
  msg_46.m_end = pvVar2;
  msg_46.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_840,
             msg_46);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_b8.nSatoshisPerK == 0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100._0_8_ = "5 * feeRate == CFeeRate(0)";
  local_100._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (CAmount **)local_100;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_848 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar3,(size_t)&local_850,0x71);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(GetFeeTest)
{
    CFeeRate feeRate, altFeeRate;

    feeRate = CFeeRate(0);
    // Must always return 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e5), CAmount(0));

    feeRate = CFeeRate(1000);
    // Must always just return the arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(9e3));

    feeRate = CFeeRate(-1000);
    // Must always just return -1 * arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(-1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(-121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(-999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(-1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(-9e3));

    feeRate = CFeeRate(123);
    // Rounds up the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(1)); // Special case: returns 1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(2));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(15));
    BOOST_CHECK_EQUAL(feeRate.GetFee(122), CAmount(16));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(1107));

    feeRate = CFeeRate(-123);
    // Truncates the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(-1)); // Special case: returns -1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(-1));

    // check alternate constructor
    feeRate = CFeeRate(1000);
    altFeeRate = CFeeRate(feeRate);
    BOOST_CHECK_EQUAL(feeRate.GetFee(100), altFeeRate.GetFee(100));

    // Check full constructor
    BOOST_CHECK(CFeeRate(CAmount(-1), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(0), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 0) == CFeeRate(0));
    // default value
    BOOST_CHECK(CFeeRate(CAmount(-1), 1000) == CFeeRate(-1));
    BOOST_CHECK(CFeeRate(CAmount(0), 1000) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 1000) == CFeeRate(1));
    // lost precision (can only resolve satoshis per kB)
    BOOST_CHECK(CFeeRate(CAmount(1), 1001) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(2), 1001) == CFeeRate(1));
    // some more integer checks
    BOOST_CHECK(CFeeRate(CAmount(26), 789) == CFeeRate(32));
    BOOST_CHECK(CFeeRate(CAmount(27), 789) == CFeeRate(34));
    // Maximum size in bytes, should not crash
    CFeeRate(MAX_MONEY, std::numeric_limits<uint32_t>::max()).GetFeePerK();

    // check multiplication operator
    // check multiplying by zero
    feeRate = CFeeRate(1000);
    BOOST_CHECK(0 * feeRate == CFeeRate(0));
    BOOST_CHECK(feeRate * 0 == CFeeRate(0));
    // check multiplying by a positive integer
    BOOST_CHECK(3 * feeRate == CFeeRate(3000));
    BOOST_CHECK(feeRate * 3 == CFeeRate(3000));
    // check multiplying by a negative integer
    BOOST_CHECK(-3 * feeRate == CFeeRate(-3000));
    BOOST_CHECK(feeRate * -3 == CFeeRate(-3000));
    // check commutativity
    BOOST_CHECK(2 * feeRate == feeRate * 2);
    // check with large numbers
    int largeNumber = 1000000;
    BOOST_CHECK(largeNumber * feeRate == feeRate * largeNumber);
    // check boundary values
    int maxInt = std::numeric_limits<int>::max();
    feeRate = CFeeRate(maxInt);
    BOOST_CHECK(feeRate * 2 == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    BOOST_CHECK(2 * feeRate == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    // check with zero fee rate
    feeRate = CFeeRate(0);
    BOOST_CHECK(feeRate * 5 == CFeeRate(0));
    BOOST_CHECK(5 * feeRate == CFeeRate(0));
}